

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_vertex
          (TrimeshPrimitiveManager *this,uint vertex_index,cbtVector3 *vertex)

{
  uchar *puVar1;
  ulong uVar2;
  float fVar3;
  
  fVar3 = (this->m_scale).m_floats[0];
  uVar2 = (ulong)(vertex_index * this->stride);
  puVar1 = this->vertexbase;
  if (this->type == PHY_DOUBLE) {
    vertex->m_floats[0] = (float)((double)fVar3 * *(double *)(puVar1 + uVar2));
    vertex->m_floats[1] =
         (float)((double)(this->m_scale).m_floats[1] * *(double *)(puVar1 + uVar2 + 8));
    fVar3 = (float)((double)(this->m_scale).m_floats[2] * *(double *)(puVar1 + uVar2 + 0x10));
  }
  else {
    vertex->m_floats[0] = fVar3 * *(float *)(puVar1 + uVar2);
    vertex->m_floats[1] = *(float *)(puVar1 + uVar2 + 4) * (this->m_scale).m_floats[1];
    fVar3 = *(float *)(puVar1 + uVar2 + 8) * (this->m_scale).m_floats[2];
  }
  vertex->m_floats[2] = fVar3;
  return;
}

Assistant:

SIMD_FORCE_INLINE void get_vertex(unsigned int vertex_index, cbtVector3& vertex) const
		{
			if (type == PHY_DOUBLE)
			{
				double* dvertices = (double*)(vertexbase + vertex_index * stride);
				vertex[0] = cbtScalar(dvertices[0] * m_scale[0]);
				vertex[1] = cbtScalar(dvertices[1] * m_scale[1]);
				vertex[2] = cbtScalar(dvertices[2] * m_scale[2]);
			}
			else
			{
				float* svertices = (float*)(vertexbase + vertex_index * stride);
				vertex[0] = svertices[0] * m_scale[0];
				vertex[1] = svertices[1] * m_scale[1];
				vertex[2] = svertices[2] * m_scale[2];
			}
		}